

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::CharacterSequencer<(TI::TMS::Personality)4>::fetch<19>
          (CharacterSequencer<(TI::TMS::Personality)4> *this)

{
  Base<(TI::TMS::Personality)4> *pBVar1;
  
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,0,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff80],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,1,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff84],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,2,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff88],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,3,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff8c],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,4,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff90],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,5,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff94],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,6,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff98],
             (this->sprite_fetcher).y);
  pBVar1 = (this->sprite_fetcher).base;
  Base<(TI::TMS::Personality)4>::posit_sprite
            (pBVar1,7,(uint)(pBVar1->ram_)._M_elems
                            [pBVar1->sprite_attribute_table_address_ & 0xffffff9c],
             (this->sprite_fetcher).y);
  return;
}

Assistant:

void fetch() {
		if(cycle < 5) {
			character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 5) {
			// Fetch: n1, c2, pat2a, pat2b, y3, x3, n3, c3, pat3a, pat3b.
			sprite_fetcher.fetch_pattern(2);
			sprite_fetcher.fetch_location(3);
			sprite_fetcher.fetch_pattern(3);
		}

		if(cycle > 14 && cycle < 19) {
			character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		// Fetch 8 new sprite Y coordinates, to begin selecting sprites for next line.
		if(cycle == 19) {
			sprite_fetcher.fetch_y(0);	sprite_fetcher.fetch_y(1);	sprite_fetcher.fetch_y(2);	sprite_fetcher.fetch_y(3);
			sprite_fetcher.fetch_y(4);	sprite_fetcher.fetch_y(5);	sprite_fetcher.fetch_y(6);	sprite_fetcher.fetch_y(7);
		}

		// Body of line: tiles themselves, plus some additional potential sprites.
		if(cycle >= 27 && cycle < 155) {
			constexpr int offset = cycle - 27;
			constexpr int block = offset >> 2;
			constexpr int sub_block = offset & 3;
			switch(sub_block) {
				case 0:	character_fetcher.fetch_name(block);	break;
				case 1:
					if(!(block & 3)) {
						character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
					} else {
						constexpr int sprite = 8 + ((block >> 2) * 3) + ((block & 3) - 1);
						sprite_fetcher.fetch_y(sprite);
					}
				break;
				case 2:
					character_fetcher.fetch_pattern(block);
					character_fetcher.fetch_colour(block);
				break;
				default: break;
			}
		}

		if(cycle >= 155 && cycle < 157) {
			character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 157) {
			// Fetch: y0, x0, n0, c0, pat0a, pat0b, y1, x1, n1, c1, pat1a, pat1b, y2, x2.
			sprite_fetcher.fetch_location(0);
			sprite_fetcher.fetch_pattern(0);
			sprite_fetcher.fetch_location(1);
			sprite_fetcher.fetch_pattern(1);
			sprite_fetcher.fetch_location(2);
		}
	}